

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::beta_dist<double>::icdf(beta_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 norm;
  result_type_conflict2 q;
  undefined8 local_8;
  
  if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
      norm = param_type::alpha(in_RDI);
      q = param_type::beta(in_RDI);
      param_type::norm(in_RDI);
      local_8 = math::inv_Beta_I((double)in_RDI,in_XMM0_Qa,q,norm);
    }
    else {
      local_8 = 1.0;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return 1;
      return math::inv_Beta_I(x, P.alpha(), P.beta(), P.norm());
    }